

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::InspectInstrForMemCopyCandidate
          (GlobOpt *this,Loop *loop,Instr *instr,MemCopyEmitData *emitData,bool *errorInInstr)

{
  OpCode OVar1;
  undefined2 other;
  MemOpCandidate *pMVar2;
  Opnd *pOVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  bool bVar7;
  SymID SVar8;
  BailOutKind BVar9;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  StackSym *pSVar13;
  JITTimeFunctionBody *pJVar14;
  FunctionJITTimeInfo *pFVar15;
  char16 *pcVar16;
  char16 *pcVar17;
  IndirOpnd *pIVar18;
  wchar local_4a8 [4];
  char16 ldValueTypeStr [256];
  char16 debugStringBuffer [42];
  wchar local_a8 [4];
  char16 debugStringBuffer_1 [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  ValueType stValueType;
  Phases *pPStack_40;
  ValueType ldValueType;
  
  if (((emitData == (MemCopyEmitData *)0x0) ||
      (pMVar2 = (emitData->super_MemOpEmitData).candidate, pMVar2 == (MemOpCandidate *)0x0)) ||
     (pMVar2->type != MEMCOPY)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4472,
                       "(emitData && emitData->candidate && emitData->candidate->IsMemCopy())",
                       "emitData && emitData->candidate && emitData->candidate->IsMemCopy()");
    if (!bVar5) goto LAB_0047512f;
    *puVar12 = 0;
  }
  pMVar2 = (emitData->super_MemOpEmitData).candidate;
  OVar1 = instr->m_opcode;
  unique0x10000ec7 = loop;
  if (OVar1 != LdElemI_A) {
    if ((OVar1 != StElemI_A_Strict) && (OVar1 != StElemI_A)) {
      return false;
    }
    pPStack_40 = (Phases *)errorInInstr;
    OVar6 = IR::Opnd::GetKind(instr->m_dst);
    if (OVar6 == OpndKindIndir) {
      pOVar3 = instr->m_dst;
      OVar6 = IR::Opnd::GetKind(pOVar3);
      if (OVar6 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar5) goto LAB_0047512f;
        *puVar12 = 0;
      }
      pSVar13 = IR::Opnd::GetStackSym((Opnd *)pOVar3[1]._vptr_Opnd);
      if (pSVar13 == (StackSym *)0x0) {
        pSVar13 = (StackSym *)0x0;
      }
      else if (pSVar13->m_type != TyVar) {
        pSVar13 = StackSym::GetVarEquivSym(pSVar13,(Func *)0x0);
      }
      if (pSVar13 == (StackSym *)0x0) {
        SVar8 = 0xffffffff;
      }
      else {
        SVar8 = (pSVar13->super_Sym).m_id;
      }
      if (SVar8 == pMVar2->base) {
        pOVar3 = instr->m_dst;
        OVar6 = IR::Opnd::GetKind(pOVar3);
        if (OVar6 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar5) goto LAB_0047512f;
          *puVar12 = 0;
        }
        pSVar13 = IR::Opnd::GetStackSym(*(Opnd **)&pOVar3[1].m_valueType);
        if (pSVar13 == (StackSym *)0x0) {
          pSVar13 = (StackSym *)0x0;
        }
        else if (pSVar13->m_type != TyVar) {
          pSVar13 = StackSym::GetVarEquivSym(pSVar13,(Func *)0x0);
        }
        if (pSVar13 == (StackSym *)0x0) {
          SVar8 = 0xffffffff;
        }
        else {
          SVar8 = (pSVar13->super_Sym).m_id;
        }
        if (SVar8 == pMVar2->index) {
          if (instr->m_kind != InstrKindProfiled) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x447c,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
            if (!bVar5) goto LAB_0047512f;
            *puVar12 = 0;
          }
          (emitData->super_MemOpEmitData).stElemInstr = instr;
          BVar9 = IR::Instr::GetBailOutKind(instr);
          (emitData->super_MemOpEmitData).bailOutKind = BVar9;
          return false;
        }
      }
    }
    if (DAT_015d346a == '\x01') {
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar10,uVar11);
      if (!bVar5) {
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
        pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar10,uVar11);
        if (!bVar5) goto LAB_00474c66;
      }
      Output::Print(L"TRACE MemCopy:");
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar14);
      pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet
                          (pFVar15,(wchar (*) [42])(ldValueTypeStr + 0xfc));
      uVar10 = Loop::GetLoopNumber(stack0xffffffffffffffb0);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar16,pcVar17,(ulong)uVar10);
      Output::Print(L"Orphan StElemI_A detected");
      IR::Instr::DumpByteCodeOffset(instr);
      pcVar16 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
      Output::Print(L" (%s)",pcVar16);
      Output::Print(L"\n");
      Output::Flush();
    }
LAB_00474c66:
    pPStack_40->phaseList[0].valid = true;
    return false;
  }
  if (((emitData->super_MemOpEmitData).stElemInstr != (Instr *)0x0) &&
     (OVar6 = IR::Opnd::GetKind(instr->m_src1), OVar6 == OpndKindIndir)) {
    pOVar3 = instr->m_src1;
    OVar6 = IR::Opnd::GetKind(pOVar3);
    if (OVar6 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      pPStack_40 = (Phases *)errorInInstr;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar5) goto LAB_0047512f;
      *puVar12 = 0;
      errorInInstr = (bool *)pPStack_40;
    }
    pSVar13 = IR::Opnd::GetStackSym((Opnd *)pOVar3[1]._vptr_Opnd);
    if (pSVar13 == (StackSym *)0x0) {
      pSVar13 = (StackSym *)0x0;
    }
    else if (pSVar13->m_type != TyVar) {
      pSVar13 = StackSym::GetVarEquivSym(pSVar13,(Func *)0x0);
    }
    if (pSVar13 == (StackSym *)0x0) {
      SVar8 = 0xffffffff;
    }
    else {
      SVar8 = (pSVar13->super_Sym).m_id;
    }
    if (SVar8 == pMVar2[1].base) {
      pOVar3 = instr->m_src1;
      OVar6 = IR::Opnd::GetKind(pOVar3);
      if (OVar6 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        pPStack_40 = (Phases *)errorInInstr;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar5) goto LAB_0047512f;
        *puVar12 = 0;
        errorInInstr = (bool *)pPStack_40;
      }
      pSVar13 = IR::Opnd::GetStackSym(*(Opnd **)&pOVar3[1].m_valueType);
      if (pSVar13 == (StackSym *)0x0) {
        pSVar13 = (StackSym *)0x0;
      }
      else if (pSVar13->m_type != TyVar) {
        pSVar13 = StackSym::GetVarEquivSym(pSVar13,(Func *)0x0);
      }
      if (pSVar13 == (StackSym *)0x0) {
        SVar8 = 0xffffffff;
      }
      else {
        SVar8 = (pSVar13->super_Sym).m_id;
      }
      if (SVar8 == pMVar2->index) {
        if (instr->m_kind != InstrKindProfiled) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x448e,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
          if (!bVar5) {
LAB_0047512f:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar12 = 0;
        }
        emitData->ldElemInstr = instr;
        pIVar18 = IR::Opnd::AsIndirOpnd(((emitData->super_MemOpEmitData).stElemInstr)->m_dst);
        local_44 = (pIVar18->m_baseOpnd->super_Opnd).m_valueType.field_0;
        pIVar18 = IR::Opnd::AsIndirOpnd(emitData->ldElemInstr->m_src1);
        other = (pIVar18->m_baseOpnd->super_Opnd).m_valueType;
        local_42 = (anon_union_2_4_ea848c7b_for_ValueType_13)other;
        bVar5 = ValueType::operator!=((ValueType *)&local_44.field_0,(ValueType)other);
        if (!bVar5) goto LAB_00474f8a;
        ValueType::ToString((ValueType *)&local_44.field_0,(wchar (*) [256])(ldValueTypeStr + 0xfc))
        ;
        ValueType::ToString((ValueType *)&local_42.field_0,(wchar (*) [256])local_4a8);
        if (DAT_015d346a == '\x01') {
          pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
          pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
          bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar10,uVar11);
          if (!bVar7) {
            pPStack_40 = (Phases *)&DAT_015cd718;
            pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
            pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
            bVar7 = Js::Phases::IsEnabled(pPStack_40,MemCopyPhase,uVar10,uVar11);
            if (!bVar7) goto LAB_00474f85;
          }
          Output::Print(L"TRACE MemCopy:");
          pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar14);
          pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar15,(wchar (*) [42])local_a8);
          uVar10 = Loop::GetLoopNumber(stack0xffffffffffffffb0);
          Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar16,pcVar17,(ulong)uVar10);
          Output::Print(L"for mismatch in Load(%s) and Store(%s) value type",local_4a8,
                        ldValueTypeStr + 0xfc);
          IR::Instr::DumpByteCodeOffset(instr);
          pcVar16 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
          Output::Print(L" (%s)",pcVar16);
          Output::Print(L"\n");
          Output::Flush();
        }
LAB_00474f85:
        ((Phases *)errorInInstr)->phaseList[0].valid = true;
LAB_00474f8a:
        return !bVar5;
      }
    }
  }
  if (DAT_015d346a == '\x01') {
    pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
    pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar10,uVar11);
    if (!bVar5) {
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar10,uVar11);
      if (!bVar5) goto LAB_00475114;
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar14);
    pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar15,(wchar (*) [42])(ldValueTypeStr + 0xfc));
    uVar10 = Loop::GetLoopNumber(stack0xffffffffffffffb0);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar16,pcVar17,(ulong)uVar10);
    Output::Print(L"Orphan LdElemI_A detected");
    if (instr != (Instr *)0x0) {
      IR::Instr::DumpByteCodeOffset(instr);
      pcVar16 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
      Output::Print(L" (%s)",pcVar16);
    }
    Output::Print(L"\n");
    Output::Flush();
  }
LAB_00475114:
  ((Phases *)errorInInstr)->phaseList[0].valid = true;
  return false;
}

Assistant:

bool
GlobOpt::InspectInstrForMemCopyCandidate(Loop* loop, IR::Instr* instr, MemCopyEmitData* emitData, bool& errorInInstr)
{
    Assert(emitData && emitData->candidate && emitData->candidate->IsMemCopy());
    Loop::MemCopyCandidate* candidate = (Loop::MemCopyCandidate*)emitData->candidate;
    if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
    {
        if (
            instr->GetDst()->IsIndirOpnd() &&
            (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->base) &&
            (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->stElemInstr = instr;
            emitData->bailOutKind = instr->GetBailOutKind();
            // Still need to find the LdElem
            return false;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Orphan StElemI_A detected"));
        errorInInstr = true;
    }
    else if (instr->m_opcode == Js::OpCode::LdElemI_A)
    {
        if (
            emitData->stElemInstr &&
            instr->GetSrc1()->IsIndirOpnd() &&
            (GetVarSymID(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->ldBase) &&
            (GetVarSymID(instr->GetSrc1()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->ldElemInstr = instr;
            ValueType stValueType = emitData->stElemInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType();
            ValueType ldValueType = emitData->ldElemInstr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType();
            if (stValueType != ldValueType)
            {
#if DBG_DUMP
                char16 stValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                stValueType.ToString(stValueTypeStr);
                char16 ldValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                ldValueType.ToString(ldValueTypeStr);
                TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("for mismatch in Load(%s) and Store(%s) value type"), ldValueTypeStr, stValueTypeStr);
#endif
                errorInInstr = true;
                return false;
            }
            // We found both instruction for this candidate
            return true;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Orphan LdElemI_A detected"));
        errorInInstr = true;
    }
    return false;
}